

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halftest.cpp
# Opt level: O0

int testround(float val)

{
  uint16_t uVar1;
  uint uVar2;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  undefined4 extraout_XMM0_Db_00;
  double dVar6;
  undefined4 extraout_XMM0_Db_01;
  double dVar7;
  float f2;
  float f1;
  float f;
  int i;
  int local_4;
  
  uVar1 = f2h(0.0);
  uVar2 = (uint)uVar1;
  fVar3 = h2f(0);
  dVar5 = std::fabs((double)CONCAT44(extraout_XMM0_Db,fVar3 - in_XMM0_Da));
  fVar3 = h2f(0);
  dVar6 = std::fabs((double)CONCAT44(extraout_XMM0_Db_00,fVar3 - in_XMM0_Da));
  fVar3 = h2f(0);
  dVar7 = std::fabs((double)CONCAT44(extraout_XMM0_Db_01,fVar3 - in_XMM0_Da));
  if (SUB84(dVar5,0) <= SUB84(dVar6,0)) {
    if (SUB84(dVar5,0) <= SUB84(dVar7,0)) {
      local_4 = 0;
    }
    else {
      fVar3 = h2f(0);
      fVar4 = h2f(0);
      printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",(double)in_XMM0_Da,(double)fVar3,
             (double)fVar4,(ulong)uVar2,(ulong)(uVar2 + 1));
      local_4 = 1;
    }
  }
  else {
    fVar3 = h2f(0);
    fVar4 = h2f(0);
    printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",(double)in_XMM0_Da,(double)fVar3,
           (double)fVar4,(ulong)uVar2,(ulong)(uVar2 - 1));
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int testround(float val)
{
    int i = f2h(val);
    float f = fabs(h2f(i)-val);
    float f1 = fabs(h2f(i-1)-val);
    float f2 = fabs(h2f(i+1)-val);
    if (f1 < f) {
        printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",
               val, i, h2f(i), i-1, h2f(i-1));
        return 1;
    }
    if (f2 < f) {
        printf("error: %g->0x%x->%g, expected ->0x%x->%g\n",
               val, i, h2f(i), i+1, h2f(i+1));
        return 1;
    }
    return 0;
}